

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

void expect_set(char *function,char *parameter,char *file,int line,unsigned_long *values,
               size_t number_of_values,CheckParameterValue check_function,int count)

{
  void *event;
  
  event = malloc(number_of_values * 8 + 0x38);
  if (values == (unsigned_long *)0x0) {
    cm_print_error("%s\n","values");
    _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
          ,0x57e);
  }
  if (number_of_values != 0) {
    memcpy((void *)((long)event + 0x38),values,number_of_values * 8);
    *(void **)((long)event + 0x28) = (void *)((long)event + 0x38);
    *(size_t *)((long)event + 0x30) = number_of_values;
    _expect_check(function,parameter,file,line,check_function,(unsigned_long)event,
                  (CheckParameterEvent *)event,count);
    return;
  }
  cm_print_error("%s\n","number_of_values");
  _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
        ,0x57f);
}

Assistant:

static void expect_set(
        const char* const function, const char* const parameter,
        const char* const file, const int line,
        const LargestIntegralType values[], const size_t number_of_values,
        const CheckParameterValue check_function, const int count) {
    CheckIntegerSet * const check_integer_set =
        (CheckIntegerSet*)malloc(sizeof(*check_integer_set) +
               (sizeof(values[0]) * number_of_values));
    LargestIntegralType * const set = (LargestIntegralType*)(
        check_integer_set + 1);
    declare_initialize_value_pointer_pointer(check_data, check_integer_set);
    assert_non_null(values);
    assert_true(number_of_values);
    memcpy(set, values, number_of_values * sizeof(values[0]));
    check_integer_set->set = set;
    check_integer_set->size_of_set = number_of_values;
    _expect_check(
        function, parameter, file, line, check_function,
        check_data.value, &check_integer_set->event, count);
}